

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmPageSettings::IsValid(ON_3dmPageSettings *this,ON_TextLog *text_log)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_TextLog *text_log_local;
  ON_3dmPageSettings *this_local;
  
  local_19 = true;
  if ((((this->m_width_mm != 0.0) || (NAN(this->m_width_mm))) || (this->m_height_mm != 0.0)) ||
     (NAN(this->m_height_mm))) {
    bVar1 = ON_IsValid(this->m_width_mm);
    if ((!bVar1) || (this->m_width_mm <= 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_width_mm = %g (should be > 0.0).\n",
                          this->m_width_mm);
      }
      local_19 = false;
    }
    bVar1 = ON_IsValid(this->m_height_mm);
    if ((!bVar1) || (this->m_height_mm <= 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_height_mm = %g (should be > 0.0).\n",
                          this->m_height_mm);
      }
      local_19 = false;
    }
    bVar1 = ON_IsValid(this->m_top_margin_mm);
    if ((!bVar1) || (this->m_top_margin_mm <= 0.0 && this->m_top_margin_mm != 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_top_margin_mm = %g (should be >= 0.0).\n",
                          this->m_top_margin_mm);
      }
      local_19 = false;
    }
    bVar1 = ON_IsValid(this->m_bottom_margin_mm);
    if ((!bVar1) || (this->m_bottom_margin_mm <= 0.0 && this->m_bottom_margin_mm != 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_bottom_margin_mm = %g (should be >= 0.0).\n",
                          this->m_bottom_margin_mm);
      }
      local_19 = false;
    }
    bVar1 = ON_IsValid(this->m_left_margin_mm);
    if ((!bVar1) || (this->m_left_margin_mm <= 0.0 && this->m_left_margin_mm != 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_left_margin_mm = %g (should be >= 0.0).\n",
                          this->m_left_margin_mm);
      }
      local_19 = false;
    }
    bVar1 = ON_IsValid(this->m_right_margin_mm);
    if ((!bVar1) || (this->m_right_margin_mm <= 0.0 && this->m_right_margin_mm != 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_right_margin_mm = %g (should be >= 0.0).\n",
                          this->m_right_margin_mm);
      }
      local_19 = false;
    }
    if (this->m_width_mm <= this->m_left_margin_mm + this->m_right_margin_mm) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_left_margin_mm+m_right_margin_mm = %g > %g = m_width_mm.\n"
                          ,this->m_left_margin_mm + this->m_right_margin_mm,this->m_width_mm);
      }
      local_19 = false;
    }
    if (this->m_height_mm <= this->m_top_margin_mm + this->m_bottom_margin_mm) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_top_margin_mm+m_bottom_margin_mm = %g > %g = m_height_mm.\n"
                          ,this->m_top_margin_mm + this->m_bottom_margin_mm,this->m_height_mm);
      }
      local_19 = false;
    }
  }
  else {
    if ((this->m_top_margin_mm != 0.0) || (NAN(this->m_top_margin_mm))) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_top_margin_mm = %g (should be 0.0).\n",
                          this->m_top_margin_mm);
      }
      local_19 = false;
    }
    if ((this->m_bottom_margin_mm != 0.0) || (NAN(this->m_bottom_margin_mm))) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_bottom_margin_mm = %g (should be 0.0).\n",
                          this->m_bottom_margin_mm);
      }
      local_19 = false;
    }
    if ((this->m_left_margin_mm != 0.0) || (NAN(this->m_left_margin_mm))) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_left_margin_mm = %g (should be 0.0).\n"
                          ,this->m_left_margin_mm);
      }
      local_19 = false;
    }
    if ((this->m_right_margin_mm != 0.0) || (NAN(this->m_right_margin_mm))) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_right_margin_mm = %g (should be 0.0).\n",
                          this->m_right_margin_mm);
      }
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_3dmPageSettings::IsValid( ON_TextLog* text_log ) const
{
  bool rc = true;

  if ( m_width_mm != 0.0 || m_height_mm != 0.0 )
  {
    if ( !ON_IsValid(m_width_mm) || m_width_mm <= 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_width_mm = %g (should be > 0.0).\n",m_width_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_height_mm) || m_height_mm <= 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_height_mm = %g (should be > 0.0).\n",m_height_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_top_margin_mm) || m_top_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm = %g (should be >= 0.0).\n",m_top_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_bottom_margin_mm) || m_bottom_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_bottom_margin_mm = %g (should be >= 0.0).\n",m_bottom_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_left_margin_mm) || m_left_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm = %g (should be >= 0.0).\n",m_left_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_right_margin_mm) || m_right_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_right_margin_mm = %g (should be >= 0.0).\n",m_right_margin_mm);
      }
      rc = false;
    }
    if ( m_left_margin_mm + m_right_margin_mm >= m_width_mm )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm+m_right_margin_mm = %g > %g = m_width_mm.\n",m_left_margin_mm + m_right_margin_mm, m_width_mm);
      }
      rc = false;
    }
    if ( m_top_margin_mm + m_bottom_margin_mm >= m_height_mm )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm+m_bottom_margin_mm = %g > %g = m_height_mm.\n",m_top_margin_mm + m_bottom_margin_mm, m_height_mm);
      }
      rc = false;
    }
  }
  else
  {
    if ( m_top_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm = %g (should be 0.0).\n",m_top_margin_mm);
      }
      rc = false;
    }
    if ( m_bottom_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_bottom_margin_mm = %g (should be 0.0).\n",m_bottom_margin_mm);
      }
      rc = false;
    }
    if ( m_left_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm = %g (should be 0.0).\n",m_left_margin_mm);
      }
      rc = false;
    }
    if ( m_right_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_right_margin_mm = %g (should be 0.0).\n",m_right_margin_mm);
      }
      rc = false;
    }
  }

  return rc;
}